

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

void __thiscall
embree::CommandLineStream::CommandLineStream
          (CommandLineStream *this,int argc,char **argv,string *name)

{
  string *this_00;
  string *in_RCX;
  long *in_RDX;
  int in_ESI;
  Stream<int> *in_RDI;
  ssize_t k;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  value_type *__x;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  allocator local_61;
  string local_60 [32];
  long local_40;
  ulong local_38;
  string *local_20;
  long *local_18;
  int local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  Stream<int>::Stream(in_RDI);
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineStream_001246c8;
  in_RDI[1].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  in_RDI[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x10e8d5);
  in_RDI[1].buffer.
  super__Vector_base<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string(this_00,local_20);
  std::shared_ptr<std::__cxx11::string>::shared_ptr<std::__cxx11::string,void>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (0 < local_c) {
    for (local_38 = 0; *(char *)(*local_18 + local_38) != '\0' && local_38 < 0x400;
        local_38 = local_38 + 1) {
      in_RDI[1].buffer.
      super__Vector_base<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&(in_RDI[1].buffer.
                             super__Vector_base<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first + 1);
    }
    in_RDI[1].buffer.
    super__Vector_base<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)&(in_RDI[1].buffer.
                           super__Vector_base<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first + 1);
  }
  for (local_40 = 1; local_40 < local_c; local_40 = local_40 + 1) {
    __x = (value_type *)&in_RDI[1].start;
    this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_18[local_40];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,(char *)this_01,&local_61);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_01,__x);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  return;
}

Assistant:

CommandLineStream (int argc, char** argv, const std::string& name = "command line")
      : i(0), j(0), charNumber(0), name(std::shared_ptr<std::string>(new std::string(name)))
    {
      if (argc > 0) {
	for (size_t i=0; argv[0][i] && i<1024; i++) charNumber++;
	charNumber++;
      }
      for (ssize_t k=1; k<argc; k++) args.push_back(argv[k]);
    }